

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_export_emit.cpp
# Opt level: O0

void __thiscall
ExportEmitString_Multiple_Test::~ExportEmitString_Multiple_Test
          (ExportEmitString_Multiple_Test *this)

{
  ExportEmitString_Multiple_Test *this_local;
  
  ~ExportEmitString_Multiple_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (ExportEmitString, Multiple) {
    using namespace std::string_literals;

    pstore::exchange::export_ns::ostringstream os;
    auto const str = R"("abc\def")"s;
    pstore::exchange::export_ns::emit_string (os, std::begin (str), std::end (str));
    constexpr auto * expected = R"("\"abc\\def\"")";
    EXPECT_EQ (os.str (), expected);
}